

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

Oop __thiscall Lodtalk::Class::getBinding(Class *this,VMContext *context)

{
  bool bVar1;
  Oop key;
  Oop value;
  Association *pointer;
  Oop result;
  VMContext *context_local;
  Class *this_local;
  
  this_local = (Class *)VMContext::getGlobalFromSymbol(context,(Oop)(this->name).field_0);
  bVar1 = isNil((Oop)this_local);
  if (bVar1) {
    key = nilOop();
    value = ProtoObject::selfOop((ProtoObject *)this);
    pointer = Association::make(context,key,value);
    this_local = (Class *)Oop::fromPointer(pointer);
  }
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop Class::getBinding(VMContext *context)
{
	// Find myself in the global dictionary
	auto result = context->getGlobalFromSymbol(name);
	if(!isNil(result))
		return result;

	// TODO: Find an existing
	return Oop::fromPointer(Association::make(context, nilOop(), selfOop()));
}